

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

char * quicly_hexdump(uint8_t *bytes,size_t len,size_t indent)

{
  byte bVar1;
  long lVar2;
  byte *pbVar3;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  int ch;
  char *p;
  char *buf;
  size_t bufsize;
  size_t row;
  size_t line;
  size_t i;
  byte *local_60;
  byte *local_50;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  byte *local_8;
  
  if (in_RDX == 0xffffffffffffffff) {
    lVar2 = in_RSI * 2;
  }
  else {
    lVar2 = (in_RDX + 0x48) * (in_RSI + 0xf >> 4);
  }
  local_60 = (byte *)(lVar2 + 1);
  local_8 = (byte *)malloc((size_t)local_60);
  if (local_8 == (byte *)0x0) {
    local_8 = (byte *)0x0;
  }
  else {
    local_50 = local_8;
    if (in_RDX == 0xffffffffffffffff) {
      for (local_28 = 0; local_28 != in_RSI; local_28 = local_28 + 1) {
        quicly_byte_to_hex((char *)local_50,*(uint8_t *)(in_RDI + local_28));
        local_50 = local_50 + 2;
      }
    }
    else {
      for (local_30 = 0; local_30 << 4 < in_RSI; local_30 = local_30 + 1) {
        for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
          *local_50 = 0x20;
          local_50 = local_50 + 1;
        }
        quicly_byte_to_hex((char *)local_50,(uint8_t)(local_30 >> 4));
        quicly_byte_to_hex((char *)(local_50 + 2),(uint8_t)(local_30 << 4));
        pbVar3 = local_50 + 4;
        local_50 = local_50 + 5;
        *pbVar3 = 0x20;
        for (local_38 = 0; local_38 < 0x10; local_38 = local_38 + 1) {
          bVar1 = 0x20;
          if (local_38 == 8) {
            bVar1 = 0x2d;
          }
          *local_50 = bVar1;
          if (local_30 * 0x10 + local_38 < in_RSI) {
            quicly_byte_to_hex((char *)(local_50 + 1),
                               *(uint8_t *)(in_RDI + local_30 * 0x10 + local_38));
          }
          else {
            local_50[1] = 0x20;
            local_50[2] = 0x20;
          }
          local_50 = local_50 + 3;
        }
        pbVar3 = local_50 + 1;
        *local_50 = 0x20;
        local_50 = local_50 + 2;
        *pbVar3 = 0x20;
        for (local_38 = 0; local_38 < 0x10; local_38 = local_38 + 1) {
          if (local_30 * 0x10 + local_38 < in_RSI) {
            bVar1 = *(byte *)(in_RDI + local_30 * 0x10 + local_38);
            if ((bVar1 < 0x20) || (0x7e < bVar1)) {
              bVar1 = 0x2e;
            }
            *local_50 = bVar1;
          }
          else {
            *local_50 = 0x20;
          }
          local_50 = local_50 + 1;
        }
        *local_50 = 10;
        local_50 = local_50 + 1;
      }
    }
    *local_50 = 0;
    if (local_60 < local_50 + (1 - (long)local_8)) {
      __assert_fail("p - buf <= bufsize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x17a6,"char *quicly_hexdump(const uint8_t *, size_t, size_t)");
    }
  }
  return (char *)local_8;
}

Assistant:

char *quicly_hexdump(const uint8_t *bytes, size_t len, size_t indent)
{
    size_t i, line, row, bufsize = indent == SIZE_MAX ? len * 2 + 1 : (indent + 5 + 3 * 16 + 2 + 16 + 1) * ((len + 15) / 16) + 1;
    char *buf, *p;

    if ((buf = malloc(bufsize)) == NULL)
        return NULL;
    p = buf;
    if (indent == SIZE_MAX) {
        for (i = 0; i != len; ++i) {
            quicly_byte_to_hex(p, bytes[i]);
            p += 2;
        }
    } else {
        for (line = 0; line * 16 < len; ++line) {
            for (i = 0; i < indent; ++i)
                *p++ = ' ';
            quicly_byte_to_hex(p, (line >> 4) & 0xff);
            p += 2;
            quicly_byte_to_hex(p, (line << 4) & 0xff);
            p += 2;
            *p++ = ' ';
            for (row = 0; row < 16; ++row) {
                *p++ = row == 8 ? '-' : ' ';
                if (line * 16 + row < len) {
                    quicly_byte_to_hex(p, bytes[line * 16 + row]);
                    p += 2;
                } else {
                    *p++ = ' ';
                    *p++ = ' ';
                }
            }
            *p++ = ' ';
            *p++ = ' ';
            for (row = 0; row < 16; ++row) {
                if (line * 16 + row < len) {
                    int ch = bytes[line * 16 + row];
                    *p++ = 0x20 <= ch && ch < 0x7f ? ch : '.';
                } else {
                    *p++ = ' ';
                }
            }
            *p++ = '\n';
        }
    }
    *p++ = '\0';

    assert(p - buf <= bufsize);

    return buf;
}